

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::RayFromToCaster::Process(RayFromToCaster *this,btDbvtNode *leaf)

{
  undefined8 uVar1;
  long in_RSI;
  long in_RDI;
  btScalar bVar2;
  btScalar t;
  Face *f;
  btScalar in_stack_000000ec;
  btVector3 *in_stack_000000f0;
  btVector3 *in_stack_000000f8;
  btVector3 *in_stack_00000100;
  btVector3 *in_stack_00000108;
  btVector3 *in_stack_00000110;
  btVector3 *in_stack_00000118;
  
  uVar1 = *(undefined8 *)(in_RSI + 0x28);
  bVar2 = rayFromToTriangle(in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000100,
                            in_stack_000000f8,in_stack_000000f0,in_stack_000000ec);
  if ((0.0 < bVar2) && (bVar2 < *(float *)(in_RDI + 0x38))) {
    *(btScalar *)(in_RDI + 0x38) = bVar2;
    *(undefined8 *)(in_RDI + 0x40) = uVar1;
  }
  *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + 1;
  return;
}

Assistant:

void				btSoftBody::RayFromToCaster::Process(const btDbvtNode* leaf)
{
	btSoftBody::Face&	f=*(btSoftBody::Face*)leaf->data;
	const btScalar		t=rayFromToTriangle(	m_rayFrom,m_rayTo,m_rayNormalizedDirection,
		f.m_n[0]->m_x,
		f.m_n[1]->m_x,
		f.m_n[2]->m_x,
		m_mint);
	if((t>0)&&(t<m_mint)) 
	{ 
		m_mint=t;m_face=&f; 
	}
	++m_tests;
}